

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# names.cpp
# Opt level: O0

string * miniros::names::parentNamespace(string *name)

{
  bool bVar1;
  int iVar2;
  undefined8 uVar3;
  long lVar4;
  long lVar5;
  string *in_RSI;
  string *in_RDI;
  size_t last_pos;
  string stripped_name;
  string error;
  string *in_stack_000002e0;
  string *in_stack_000002e8;
  string *in_stack_ffffffffffffff18;
  InvalidNameException *in_stack_ffffffffffffff20;
  string *__s;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this;
  allocator<char> local_92;
  allocator<char> local_91;
  long local_90;
  string local_88 [32];
  string local_68 [35];
  allocator<char> local_45;
  undefined4 local_44;
  allocator<char> local_3d [13];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  string *local_10;
  
  this = &local_30;
  __s = in_RDI;
  local_10 = in_RSI;
  std::__cxx11::string::string((string *)this);
  bVar1 = validate(in_stack_000002e8,in_stack_000002e0);
  if (!bVar1) {
    uVar3 = __cxa_allocate_exception(0x10);
    InvalidNameException::InvalidNameException(in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
    __cxa_throw(uVar3,&InvalidNameException::typeinfo,InvalidNameException::~InvalidNameException);
  }
  iVar2 = std::__cxx11::string::compare((char *)local_10);
  if (iVar2 == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(this,(char *)__s,(allocator<char> *)in_RDI);
    std::allocator<char>::~allocator(local_3d);
    local_44 = 1;
  }
  else {
    iVar2 = std::__cxx11::string::compare((char *)local_10);
    if (iVar2 == 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>(this,(char *)__s,(allocator<char> *)in_RDI)
      ;
      std::allocator<char>::~allocator(&local_45);
      local_44 = 1;
    }
    else {
      std::__cxx11::string::string(local_68);
      lVar4 = std::__cxx11::string::find_last_of((char)local_10,0x2f);
      lVar5 = std::__cxx11::string::size();
      if (lVar4 == lVar5 + -1) {
        std::__cxx11::string::size();
        std::__cxx11::string::substr((ulong)local_88,(ulong)local_10);
        std::__cxx11::string::operator=(local_68,local_88);
        std::__cxx11::string::~string(local_88);
      }
      else {
        std::__cxx11::string::operator=(local_68,local_10);
      }
      local_90 = std::__cxx11::string::find_last_of((char)local_68,0x2f);
      if (local_90 == -1) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  (this,(char *)__s,(allocator<char> *)in_RDI);
        std::allocator<char>::~allocator(&local_91);
      }
      else if (local_90 == 0) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  (this,(char *)__s,(allocator<char> *)in_RDI);
        std::allocator<char>::~allocator(&local_92);
      }
      else {
        std::__cxx11::string::substr((ulong)in_RDI,(ulong)local_68);
      }
      local_44 = 1;
      std::__cxx11::string::~string(local_68);
    }
  }
  std::__cxx11::string::~string((string *)&local_30);
  return __s;
}

Assistant:

std::string parentNamespace(const std::string& name)
{
  std::string error;
  if (!validate(name, error))
  {
  	throw InvalidNameException(error);
  }

  if (!name.compare(""))  return "";
  if (!name.compare("/")) return "/"; 

  std::string stripped_name;

  // rstrip trailing slash
  if (name.find_last_of('/') == name.size()-1)
    stripped_name = name.substr(0, name.size() -2);
  else
    stripped_name = name;

  //pull everything up to the last /
  size_t last_pos = stripped_name.find_last_of('/');
  if (last_pos == std::string::npos)
  {
    return "";
  }
  else if (last_pos == 0)
    return "/";
  return stripped_name.substr(0, last_pos);
}